

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

int __thiscall Catch::Session::runInternal(Session *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  Config *pCVar5;
  Context *this_00;
  undefined4 extraout_var;
  vectorStrings *this_01;
  IEventListener *pIVar6;
  uint64_t uVar7;
  int *piVar8;
  exception *ex;
  undefined1 local_2d8 [8];
  Totals totals;
  TestGroup tests;
  StringRef local_68;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *spec;
  const_iterator __end3;
  const_iterator __begin3;
  vectorStrings *__range3;
  vectorStrings *invalidSpecs;
  IEventListenerPtr reporter;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) != 0) {
    return 1;
  }
  if ((((this->m_configData).showHelp & 1U) != 0) || (((this->m_configData).libIdentify & 1U) != 0))
  {
    return 0;
  }
  if ((this->m_configData).shardCount <= (this->m_configData).shardIndex) {
    poVar4 = cerr();
    poVar4 = std::operator<<(poVar4,"The shard count (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_configData).shardCount);
    poVar4 = std::operator<<(poVar4,") must be greater than the shard index (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_configData).shardIndex);
    poVar4 = std::operator<<(poVar4,")\n");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    return 1;
  }
  config(this);
  pCVar5 = Detail::unique_ptr<Catch::Config>::operator*(&this->m_config);
  seedRng(&pCVar5->super_IConfig);
  if (((this->m_configData).filenamesAsTags & 1U) != 0) {
    anon_unknown_26::applyFilenamesAsTags();
  }
  this_00 = getCurrentMutableContext();
  pCVar5 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
  Context::setConfig(this_00,&pCVar5->super_IConfig);
  pCVar5 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
  anon_unknown_26::prepareReporters((anon_unknown_26 *)&invalidSpecs,pCVar5);
  pCVar5 = Detail::unique_ptr<Catch::Config>::operator->(&this->m_config);
  iVar2 = (*(pCVar5->super_IConfig)._vptr_IConfig[0xd])();
  this_01 = TestSpec::getInvalidSpecs_abi_cxx11_((TestSpec *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_01);
  if (!bVar1) {
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    spec = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&spec), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
      pIVar6 = Detail::unique_ptr<Catch::IEventListener>::operator->
                         ((unique_ptr<Catch::IEventListener> *)&invalidSpecs);
      StringRef::StringRef(&local_68,local_58);
      (*pIVar6->_vptr_IEventListener[3])(pIVar6,local_68.m_start,local_68.m_size);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    this_local._4_4_ = 1;
    goto LAB_0012b682;
  }
  pIVar6 = Detail::unique_ptr<Catch::IEventListener>::operator*
                     ((unique_ptr<Catch::IEventListener> *)&invalidSpecs);
  pCVar5 = Detail::unique_ptr<Catch::Config>::operator*(&this->m_config);
  bVar1 = list(pIVar6,pCVar5);
  if (bVar1) {
    this_local._4_4_ = 0;
    goto LAB_0012b682;
  }
  pCVar5 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
  anon_unknown_26::TestGroup::TestGroup
            ((TestGroup *)&totals.testCases.skipped,(IEventListenerPtr *)&invalidSpecs,pCVar5);
  anon_unknown_26::TestGroup::execute((Totals *)local_2d8,(TestGroup *)&totals.testCases.skipped);
  bVar1 = anon_unknown_26::TestGroup::hadUnmatchedTestSpecs((TestGroup *)&totals.testCases.skipped);
  if (bVar1) {
    pCVar5 = Detail::unique_ptr<Catch::Config>::operator->(&this->m_config);
    uVar3 = (*(pCVar5->super_IConfig)._vptr_IConfig[7])();
    if ((uVar3 & 1) == 0) goto LAB_0012b549;
    this_local._4_4_ = 3;
  }
  else {
LAB_0012b549:
    uVar7 = Counts::total((Counts *)&totals.assertions.skipped);
    if (uVar7 == 0) {
      pCVar5 = Detail::unique_ptr<Catch::Config>::operator->(&this->m_config);
      uVar3 = (*(pCVar5->super_IConfig)._vptr_IConfig[8])();
      if ((uVar3 & 1) == 0) {
        this_local._4_4_ = 2;
        goto LAB_0012b676;
      }
    }
    uVar7 = Counts::total((Counts *)&totals.assertions.skipped);
    if ((uVar7 != 0) &&
       (uVar7 = Counts::total((Counts *)&totals.assertions.skipped),
       uVar7 == totals.testCases.failedButOk)) {
      pCVar5 = Detail::unique_ptr<Catch::Config>::operator->(&this->m_config);
      uVar3 = (*(pCVar5->super_IConfig)._vptr_IConfig[8])();
      if ((uVar3 & 1) == 0) {
        this_local._4_4_ = 4;
        goto LAB_0012b676;
      }
    }
    ex._4_4_ = (undefined4)totals.assertions.passed;
    piVar8 = std::min<int>(&(anonymous_namespace)::MaxExitCode,(int *)((long)&ex + 4));
    this_local._4_4_ = *piVar8;
  }
LAB_0012b676:
  anon_unknown_26::TestGroup::~TestGroup((TestGroup *)&totals.testCases.skipped);
LAB_0012b682:
  Detail::unique_ptr<Catch::IEventListener>::~unique_ptr
            ((unique_ptr<Catch::IEventListener> *)&invalidSpecs);
  return this_local._4_4_;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }